

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O0

int __thiscall
QStatusBar::insertPermanentWidget(QStatusBar *this,int index,QWidget *widget,int stretch)

{
  bool bVar1;
  int iVar2;
  QStatusBarPrivate *pQVar3;
  qsizetype qVar4;
  undefined4 in_ECX;
  long in_RDX;
  uint in_ESI;
  QStatusBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QStatusBar *in_stack_00000028;
  int idx;
  QStatusBarPrivate *d;
  SBItem item;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint uVar5;
  QWidgetPrivate *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  char cVar6;
  uint local_4c;
  uint local_3c;
  char local_38 [40];
  undefined4 local_10;
  undefined4 uStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == 0) {
    local_3c = 0xffffffff;
  }
  else {
    pQVar3 = d_func((QStatusBar *)0x6a3b67);
    _local_10 = CONCAT44(1,in_ECX);
    iVar2 = QStatusBarPrivate::indexToLastNonPermanentWidget(in_RDI);
    cVar6 = '\x01';
    uVar5 = in_stack_ffffffffffffff6c;
    if (-1 < (int)in_ESI) {
      in_stack_ffffffffffffff70 = (QWidgetPrivate *)(long)(int)in_ESI;
      qVar4 = QList<QStatusBarPrivate::SBItem>::size(&pQVar3->items);
      cVar6 = '\x01';
      uVar5 = in_stack_ffffffffffffff6c;
      if ((long)in_stack_ffffffffffffff70 <= qVar4) {
        uVar5 = in_stack_ffffffffffffff6c & 0xffffff;
        if (-1 < iVar2) {
          uVar5 = CONCAT13((int)in_ESI <= iVar2,(int3)in_stack_ffffffffffffff6c);
        }
        cVar6 = (char)(uVar5 >> 0x18);
      }
    }
    local_4c = in_ESI;
    if (cVar6 != '\0') {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)CONCAT17(cVar6,in_stack_ffffffffffffff78),
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (char *)CONCAT44(uVar5,in_stack_ffffffffffffff68));
      QMessageLogger::warning
                (local_38,
                 "QStatusBar::insertPermanentWidget: Index out of range (%d), appending widget",
                 (ulong)in_ESI);
      qVar4 = QList<QStatusBarPrivate::SBItem>::size(&pQVar3->items);
      local_4c = (uint)qVar4;
    }
    QList<QStatusBarPrivate::SBItem>::insert
              ((QList<QStatusBarPrivate::SBItem> *)CONCAT17(cVar6,in_stack_ffffffffffffff78),
               (qsizetype)in_stack_ffffffffffffff70,
               (parameter_type)CONCAT44(uVar5,in_stack_ffffffffffffff68));
    reformat(in_stack_00000028);
    QWidgetPrivate::get((QWidget *)0x6a3c9e);
    bVar1 = QWidgetPrivate::isExplicitlyHidden(in_stack_ffffffffffffff70);
    if (!bVar1) {
      QWidget::show((QWidget *)in_RDI);
    }
    local_3c = local_4c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

int QStatusBar::insertPermanentWidget(int index, QWidget *widget, int stretch)
{
    if (!widget)
        return -1;

    Q_D(QStatusBar);
    QStatusBarPrivate::SBItem item{widget, stretch, QStatusBarPrivate::Permanent};

    int idx = d->indexToLastNonPermanentWidget();
    if (Q_UNLIKELY(index < 0 || index > d->items.size() || (idx >= 0 && index <= idx))) {
        qWarning("QStatusBar::insertPermanentWidget: Index out of range (%d), appending widget", index);
        index = d->items.size();
    }
    d->items.insert(index, item);

    reformat();
    if (!QWidgetPrivate::get(widget)->isExplicitlyHidden())
        widget->show();

    return index;
}